

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

void __thiscall sf::priv::ClipboardImpl::ClipboardImpl(ClipboardImpl *this)

{
  Display *pDVar1;
  Atom AVar2;
  Window WVar3;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  ClipboardImpl *local_10;
  ClipboardImpl *this_local;
  
  this->m_window = 0;
  local_10 = this;
  String::String(&this->m_clipboardContents);
  std::deque<_XEvent,_std::allocator<_XEvent>_>::deque(&this->m_events);
  this->m_requestResponded = false;
  pDVar1 = OpenDisplay();
  this->m_display = pDVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"CLIPBOARD",&local_41);
  AVar2 = getAtom(&local_40,false);
  this->m_clipboard = AVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"TARGETS",&local_69);
  AVar2 = getAtom(&local_68,false);
  this->m_targets = AVar2;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"TEXT",&local_91);
  AVar2 = getAtom(&local_90,false);
  this->m_text = AVar2;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"UTF8_STRING",&local_b9);
  AVar2 = getAtom(&local_b8,true);
  this->m_utf8String = AVar2;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"SFML_CLIPBOARD_TARGET_PROPERTY",&local_e1);
  AVar2 = getAtom(&local_e0,false);
  this->m_targetProperty = AVar2;
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pDVar1 = this->m_display;
  WVar3 = XCreateSimpleWindow(pDVar1,*(undefined8 *)
                                      (*(long *)(pDVar1 + 0xe8) + 0x10 +
                                      (long)*(int *)(pDVar1 + 0xe0) * 0x80),0,0,1,1,0,0,0);
  this->m_window = WVar3;
  XSelectInput(this->m_display,this->m_window,0x1f);
  return;
}

Assistant:

ClipboardImpl::ClipboardImpl() :
m_window (0),
m_requestResponded(false)
{
    // Open a connection with the X server
    m_display = OpenDisplay();

    // Get the atoms we need to make use of the clipboard
    m_clipboard      = getAtom("CLIPBOARD",                      false);
    m_targets        = getAtom("TARGETS",                        false);
    m_text           = getAtom("TEXT",                           false);
    m_utf8String     = getAtom("UTF8_STRING",                    true );
    m_targetProperty = getAtom("SFML_CLIPBOARD_TARGET_PROPERTY", false);

    // Create a hidden window that will broker our clipboard interactions with X
    m_window = XCreateSimpleWindow(m_display, DefaultRootWindow(m_display), 0, 0, 1, 1, 0, 0, 0);

    // Register the events we are interested in
    XSelectInput(m_display, m_window, SelectionNotify | SelectionClear | SelectionRequest);
}